

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void utrie2_freeze_63(UTrie2 *trie,UTrie2ValueBits valueBits,UErrorCode *pErrorCode)

{
  uint32_t uVar1;
  UNewTrie2 *buffer;
  bool bVar2;
  short sVar3;
  undefined4 *puVar4;
  int32_t *piVar5;
  uint32_t *puVar6;
  uint16_t uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  UNewTrie2 *pUVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  uint16_t uVar16;
  uint32_t *puVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar34;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  uint32_t local_6c;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if (trie == (UTrie2 *)0x0 || UTRIE2_32_VALUE_BITS < valueBits) {
LAB_00193166:
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  buffer = trie->newTrie;
  if (buffer == (UNewTrie2 *)0x0) {
    if ((trie->data16 == (uint16_t *)0x0) == valueBits) {
      return;
    }
    goto LAB_00193166;
  }
  if (buffer->isCompacted == '\0') {
    local_6c = utrie2_get32_63(trie,0x10ffff);
    uVar1 = buffer->initialValue;
    iVar13 = -1;
    if (uVar1 == local_6c) {
      iVar13 = buffer->index2NullOffset;
    }
    iVar11 = -1;
    if (uVar1 == local_6c) {
      iVar11 = buffer->dataNullOffset;
    }
    lVar18 = 0x220;
    iVar9 = 0x110000;
    do {
      lVar21 = (long)(int)lVar18;
      while( true ) {
        lVar18 = lVar21 + -1;
        iVar8 = buffer->index1[lVar21 + -1];
        if (iVar8 != iVar13) break;
        bVar2 = iVar9 < 0x801;
        iVar9 = iVar9 + -0x800;
        lVar21 = lVar18;
        if (bVar2) goto LAB_0019330b;
      }
      if (iVar8 == buffer->index2NullOffset) {
        if (uVar1 != local_6c) {
LAB_00193e81:
          uVar23 = iVar9 + 0x7ffU & 0xfffff800;
          if (uVar23 != 0x110000) {
            buffer->highStart = uVar23;
            trie->highStart = uVar23;
            if (0x10ffff < (int)uVar23) goto LAB_00193352;
            goto LAB_0019331e;
          }
          local_6c = trie->errorValue;
          uVar23 = 0x110000;
          buffer->highStart = 0x110000;
          trie->highStart = 0x110000;
          goto LAB_00193352;
        }
        iVar9 = iVar9 + -0x800;
      }
      else {
        lVar21 = 0x40;
        iVar13 = iVar11;
        do {
          lVar26 = (long)(int)lVar21;
          while (iVar19 = iVar9, iVar11 = buffer->index2[(long)iVar8 + lVar26 + -1],
                iVar11 == iVar13) {
            bVar2 = lVar26 < 2;
            lVar26 = lVar26 + -1;
            iVar9 = iVar19 + -0x20;
            iVar11 = iVar13;
            if (bVar2) goto LAB_001932fd;
          }
          iVar9 = iVar19;
          if (iVar11 == buffer->dataNullOffset) {
            if (uVar1 != local_6c) goto LAB_00193e81;
          }
          else {
            uVar22 = 0x21;
            do {
              if (buffer->data[(long)iVar11 + (uVar22 - 2)] != local_6c) goto LAB_00193e81;
              iVar9 = iVar9 + -1;
              uVar22 = uVar22 - 1;
            } while (1 < uVar22);
          }
          iVar9 = iVar19 + -0x20;
          lVar21 = lVar26 + -1;
          iVar13 = iVar11;
        } while (1 < lVar26);
LAB_001932fd:
        iVar9 = iVar19 + -0x20;
      }
      iVar13 = iVar8;
    } while (0 < iVar9);
LAB_0019330b:
    uVar23 = 0;
    buffer->highStart = 0;
    trie->highStart = 0;
LAB_0019331e:
    uVar10 = 0x10000;
    if (0x10000 < (int)uVar23) {
      uVar10 = uVar23;
    }
    utrie2_setRange32_63(trie,uVar10,0x10ffff,trie->initialValue,'\x01',pErrorCode);
    if (U_ZERO_ERROR < *pErrorCode) {
      return;
    }
LAB_00193352:
    auVar32 = _DAT_001fa910;
    auVar27 = _DAT_001f6c00;
    piVar5 = buffer->map + 1;
    lVar18 = 0;
    auVar33 = _DAT_001f6350;
    do {
      if (SUB164(auVar33 ^ auVar27,4) == -0x80000000 && SUB164(auVar33 ^ auVar27,0) < -0x7ffffffa) {
        piVar5[-1] = (int)lVar18;
        *piVar5 = (int)lVar18 + 0x20;
      }
      auVar29 = _DAT_001f6350;
      auVar28 = _DAT_001f6340;
      lVar21 = auVar33._8_8_;
      auVar33._0_8_ = auVar33._0_8_ + auVar32._0_8_;
      auVar33._8_8_ = lVar21 + auVar32._8_8_;
      piVar5 = piVar5 + 2;
      lVar18 = lVar18 + 0x40;
    } while (lVar18 != 0xc0);
    iVar13 = buffer->dataLength;
    uVar10 = 0xc0;
    if (0xc0 < iVar13) {
      uVar10 = 0xc0;
      lVar18 = 0x40;
      iVar11 = 2;
      uVar20 = 0xc0;
      do {
        while( true ) {
          if (uVar20 == 0x880) {
            lVar18 = 0x20;
            iVar11 = 1;
          }
          lVar21 = (long)((int)uVar20 >> 5);
          iVar9 = (int)lVar18;
          if (0 < buffer->map[lVar21]) break;
LAB_0019376a:
          uVar20 = uVar20 + iVar9;
          if (iVar13 <= (int)uVar20) goto LAB_0019382b;
        }
        puVar17 = buffer->data;
        if (-1 < (int)(uVar10 - iVar9)) {
          lVar26 = 0;
          iVar8 = 0;
          puVar6 = puVar17;
          iVar13 = iVar9 + 1;
LAB_0019347c:
          do {
            if (*(uint32_t *)((long)puVar6 + lVar26) != puVar6[(int)uVar20]) goto LAB_00193496;
            iVar13 = iVar13 + -1;
            puVar6 = puVar6 + 1;
          } while (1 < iVar13);
          uVar24 = iVar11 - (uint)(iVar11 != 0);
          auVar32._4_4_ = 0;
          auVar32._0_4_ = uVar24;
          auVar32._8_4_ = uVar24;
          auVar32._12_4_ = 0;
          uVar22 = 0;
          lVar26 = 0;
          do {
            auVar31._8_4_ = (int)lVar26;
            auVar31._0_8_ = lVar26;
            auVar31._12_4_ = (int)((ulong)lVar26 >> 0x20);
            auVar33 = auVar32 ^ auVar27;
            auVar35 = (auVar31 | auVar29) ^ auVar27;
            iVar19 = auVar33._4_4_;
            iVar13 = (int)uVar22;
            if ((bool)(~(iVar19 < auVar35._4_4_ ||
                        auVar33._0_4_ < auVar35._0_4_ && auVar35._4_4_ == iVar19) & 1)) {
              buffer->map[lVar21 + lVar26] = iVar8 + iVar13;
            }
            if (auVar35._12_4_ <= auVar33._12_4_ &&
                (auVar35._8_4_ <= auVar33._8_4_ || auVar35._12_4_ != auVar33._12_4_)) {
              buffer->map[lVar21 + lVar26 + 1] = iVar8 + iVar13 + 0x20;
            }
            auVar31 = (auVar31 | auVar28) ^ auVar27;
            iVar34 = auVar31._4_4_;
            if (iVar34 <= iVar19 && (iVar34 != iVar19 || auVar31._0_4_ <= auVar33._0_4_)) {
              buffer->map[lVar21 + lVar26 + 2] = iVar8 + iVar13 + 0x40;
              buffer->map[lVar21 + lVar26 + 3] = iVar8 + iVar13 + 0x60;
            }
            lVar26 = lVar26 + 4;
            uVar22 = uVar22 + 0x80;
          } while (((ulong)uVar24 * 0x20 + 0x80 & 0xffffffffffffff80) != uVar22);
          iVar13 = buffer->dataLength;
          goto LAB_0019376a;
        }
LAB_001934a7:
        iVar13 = iVar9 + -3;
        lVar15 = (long)(int)uVar10 * 4 + lVar18 * -4;
        lVar26 = lVar18 + -4;
        do {
          lVar15 = lVar15 + 0x10;
          puVar6 = puVar17;
          iVar8 = iVar13;
          while (*(uint32_t *)((long)puVar6 + lVar15) == puVar6[(int)uVar20]) {
            iVar8 = iVar8 + -1;
            puVar6 = puVar6 + 1;
            if (iVar8 < 2) goto LAB_00193503;
          }
          lVar25 = lVar26 + -4;
          iVar13 = iVar13 + -4;
          bVar2 = 4 < lVar26;
          lVar26 = lVar25;
        } while (bVar2);
        if ((int)uVar10 < (int)uVar20) {
LAB_00193503:
          uVar24 = iVar11 - (uint)(iVar11 != 0);
          auVar35._4_4_ = 0;
          auVar35._0_4_ = uVar24;
          auVar35._8_4_ = uVar24;
          auVar35._12_4_ = 0;
          iVar8 = (int)lVar26;
          iVar13 = -iVar8;
          auVar35 = auVar35 ^ auVar27;
          uVar22 = 0;
          do {
            auVar30._8_4_ = (int)uVar22;
            auVar30._0_8_ = uVar22;
            auVar30._12_4_ = (int)(uVar22 >> 0x20);
            auVar32 = (auVar30 | auVar29) ^ auVar27;
            iVar19 = auVar35._4_4_;
            if ((bool)(~(iVar19 < auVar32._4_4_ ||
                        auVar35._0_4_ < auVar32._0_4_ && auVar32._4_4_ == iVar19) & 1)) {
              buffer->map[lVar21 + uVar22] = uVar10 + iVar13;
            }
            if (auVar32._12_4_ <= auVar35._12_4_ &&
                (auVar32._8_4_ <= auVar35._8_4_ || auVar32._12_4_ != auVar35._12_4_)) {
              buffer->map[lVar21 + uVar22 + 1] = uVar10 + iVar13 + 0x20;
            }
            auVar32 = (auVar30 | auVar28) ^ auVar27;
            iVar34 = auVar32._4_4_;
            if (iVar34 <= iVar19 && (iVar34 != iVar19 || auVar32._0_4_ <= auVar35._0_4_)) {
              buffer->map[lVar21 + uVar22 + 2] = uVar10 + iVar13 + 0x40;
              buffer->map[lVar21 + uVar22 + 3] = uVar10 + iVar13 + 0x60;
            }
            uVar22 = uVar22 + 4;
            iVar13 = iVar13 + 0x80;
          } while (((ulong)uVar24 + 4 & 0xfffffffffffffffc) != uVar22);
          uVar20 = uVar20 + iVar8;
          if (iVar9 - iVar8 != 0 && iVar8 <= iVar9) {
            iVar13 = 0;
            do {
              puVar17[(int)uVar10] = puVar17[(int)uVar20];
              puVar17 = puVar17 + 1;
              iVar19 = iVar13 + -1;
              uVar24 = iVar13 + (iVar9 - iVar8);
              iVar13 = iVar19;
            } while (1 < uVar24);
            uVar10 = uVar10 - iVar19;
            uVar20 = uVar20 - iVar19;
          }
        }
        else {
          piVar5 = buffer->map + lVar21;
          iVar13 = iVar11 + 1;
          uVar10 = uVar20;
          do {
            *piVar5 = uVar10;
            uVar10 = uVar10 + 0x20;
            piVar5 = piVar5 + 1;
            iVar13 = iVar13 + -1;
            uVar20 = uVar10;
          } while (1 < iVar13);
        }
        iVar13 = buffer->dataLength;
      } while ((int)uVar20 < iVar13);
    }
LAB_0019382b:
    if (0 < buffer->index2Length) {
      iVar13 = 0;
      do {
        if (iVar13 == 0x820) {
          iVar13 = 0xa60;
        }
        buffer->index2[iVar13] = buffer->map[buffer->index2[iVar13] >> 5];
        iVar13 = iVar13 + 1;
      } while (iVar13 < buffer->index2Length);
    }
    buffer->dataNullOffset = buffer->map[buffer->dataNullOffset >> 5];
    if ((uVar10 & 3) != 0) {
      uVar1 = buffer->initialValue;
      puVar17 = buffer->data + (int)uVar10;
      do {
        *puVar17 = uVar1;
        uVar10 = uVar10 + 1;
        puVar17 = puVar17 + 1;
      } while ((uVar10 & 3) != 0);
    }
    buffer->dataLength = uVar10;
    if (0x10000 < (int)uVar23) {
      piVar5 = buffer->map + 3;
      lVar18 = -0x900;
      auVar28 = _DAT_001f6340;
      auVar29 = _DAT_001f6350;
      do {
        iVar13 = (int)lVar18;
        if (SUB164(auVar29 ^ auVar27,4) == -0x80000000 && SUB164(auVar29 ^ auVar27,0) < -0x7fffffdf)
        {
          piVar5[-3] = iVar13 + 0x900;
          piVar5[-2] = iVar13 + 0x940;
        }
        if (SUB164(auVar28 ^ auVar27,4) == -0x80000000 && SUB164(auVar28 ^ auVar27,0) < -0x7fffffdf)
        {
          piVar5[-1] = iVar13 + 0x980;
          *piVar5 = iVar13 + 0x9c0;
        }
        lVar21 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 4;
        auVar29._8_8_ = lVar21 + 4;
        lVar21 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 4;
        auVar28._8_8_ = lVar21 + 4;
        piVar5 = piVar5 + 4;
        lVar18 = lVar18 + 0x100;
      } while (lVar18 != 0);
      uVar23 = (buffer->highStart + -0x10000 >> 0xb) + 0x840;
      if (0xa60 < buffer->index2Length) {
        uVar10 = 0xa60;
        do {
          lVar21 = (long)(int)uVar10;
          lVar18 = lVar21 * 4 + 0x880;
          uVar20 = uVar10;
LAB_00193bd8:
          uVar24 = uVar10;
          if (0x3f < (int)uVar23) {
            lVar26 = 0x880;
            uVar22 = 0;
            do {
              uVar14 = 0x41;
              pUVar12 = buffer;
              while (uVar24 = (uint)lVar21,
                    *(int *)((long)pUVar12->index1 + lVar26) ==
                    *(int *)((long)pUVar12->index1 + lVar18)) {
                uVar14 = uVar14 - 1;
                pUVar12 = (UNewTrie2 *)(pUVar12->index1 + 1);
                if (uVar14 < 2) {
                  buffer->map[(int)uVar24 >> 6] = (int32_t)uVar22;
                  lVar21 = lVar21 + 0x40;
                  lVar18 = lVar18 + 0x100;
                  uVar20 = uVar20 + 0x40;
                  if (buffer->index2Length <= lVar21) goto LAB_00193db5;
                  goto LAB_00193bd8;
                }
              }
              uVar22 = uVar22 + 1;
              lVar26 = lVar26 + 4;
            } while (uVar22 != uVar23 - 0x3f);
          }
          lVar18 = (long)(int)uVar23 * 4 + 0x784;
          iVar11 = 0x40;
          pUVar12 = buffer;
          iVar13 = iVar11;
          uVar22 = 0x3f;
          do {
            while (iVar9 = (int)uVar24 >> 6,
                  *(int *)((long)pUVar12->index1 + lVar18) != pUVar12->index2[(int)uVar24]) {
              iVar11 = iVar13 + -1;
              lVar18 = lVar18 + 4;
              bVar2 = uVar22 < 2;
              pUVar12 = buffer;
              iVar13 = iVar11;
              uVar22 = uVar22 - 1;
              if (bVar2) {
                if ((int)uVar24 <= (int)uVar23) {
                  buffer->map[iVar9] = uVar24;
                  uVar23 = uVar24 + 0x40;
                  uVar10 = uVar23;
                  goto LAB_00193d20;
                }
                buffer->map[iVar9] = uVar23;
                uVar22 = 0;
                goto LAB_00193cda;
              }
            }
            iVar11 = iVar11 + -1;
            pUVar12 = (UNewTrie2 *)(pUVar12->index1 + 1);
          } while (1 < iVar11);
          buffer->map[iVar9] = uVar23 - (int)uVar22;
          if ((long)uVar22 < 0x40) {
LAB_00193cda:
            iVar11 = uVar20 + (int)uVar22;
            piVar5 = buffer->index2;
            iVar13 = 0;
            do {
              piVar5[(int)uVar23] = piVar5[iVar11];
              piVar5 = piVar5 + 1;
              iVar9 = iVar13 + -1;
              iVar8 = iVar13 - (int)uVar22;
              iVar13 = iVar9;
            } while (1 < iVar8 + 0x40U);
            uVar23 = uVar23 - iVar9;
            uVar10 = iVar11 - iVar9;
          }
          else {
            uVar10 = uVar24 + (int)uVar22;
          }
LAB_00193d20:
        } while ((int)uVar10 < buffer->index2Length);
      }
LAB_00193db5:
      lVar18 = 0;
      do {
        buffer->index1[lVar18] = buffer->map[buffer->index1[lVar18] >> 6];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x220);
      buffer->index2NullOffset = buffer->map[buffer->index2NullOffset >> 6];
      if ((uVar23 & 3) != 0) {
        piVar5 = buffer->index2 + (int)uVar23;
        do {
          *piVar5 = 0x3fffc;
          uVar23 = uVar23 + 1;
          piVar5 = piVar5 + 1;
        } while ((uVar23 & 3) != 0);
      }
      buffer->index2Length = uVar23;
      uVar10 = buffer->dataLength;
    }
    puVar17 = buffer->data;
    buffer->dataLength = uVar10 + 1;
    puVar17[(int)uVar10] = local_6c;
    uVar23 = buffer->dataLength;
    if ((uVar23 & 3) != 0) {
      uVar1 = trie->initialValue;
      do {
        buffer->dataLength = uVar23 + 1;
        puVar17[(int)uVar23] = uVar1;
        uVar23 = buffer->dataLength;
      } while ((uVar23 & 3) != 0);
    }
    buffer->isCompacted = '\x01';
    if (U_ZERO_ERROR < *pErrorCode) {
      return;
    }
  }
  uVar23 = trie->highStart;
  if ((int)uVar23 < 0x10001) {
    iVar11 = 0;
    iVar13 = 0x840;
    if (valueBits == UTRIE2_16_VALUE_BITS) {
      iVar11 = 0x840;
    }
  }
  else {
    iVar13 = buffer->index2Length;
    iVar11 = 0;
    if (valueBits == UTRIE2_16_VALUE_BITS) {
      iVar11 = iVar13;
    }
    if (0xffff < iVar13) goto LAB_001937ef;
  }
  if (((iVar11 < 0xf780) && (buffer->dataNullOffset + iVar11 < 0x10000)) &&
     (iVar9 = buffer->dataLength, iVar9 + iVar11 < 0x3fffd)) {
    if (valueBits == UTRIE2_16_VALUE_BITS) {
      iVar9 = (iVar9 + iVar13) * 2;
    }
    else {
      iVar9 = iVar9 * 4 + iVar13 * 2;
    }
    puVar4 = (undefined4 *)uprv_malloc_63((long)(iVar9 + 0x10));
    trie->memory = puVar4;
    if (puVar4 != (undefined4 *)0x0) {
      trie->length = iVar9 + 0x10;
      trie->isMemoryOwned = '\x01';
      trie->indexLength = iVar13;
      uVar10 = buffer->dataLength;
      trie->dataLength = uVar10;
      uVar7 = 0xffff;
      if (0x10000 < (int)uVar23) {
        uVar7 = (uint16_t)buffer->index2NullOffset;
      }
      trie->index2NullOffset = uVar7;
      sVar3 = (short)iVar11;
      uVar16 = (short)buffer->dataNullOffset + sVar3;
      trie->dataNullOffset = uVar16;
      trie->highValueIndex = iVar11 + uVar10 + -4;
      *puVar4 = 0x54726932;
      *(short *)(puVar4 + 1) = (short)valueBits;
      *(short *)((long)puVar4 + 6) = (short)iVar13;
      *(short *)(puVar4 + 2) = (short)(uVar10 >> 2);
      *(uint16_t *)((long)puVar4 + 10) = uVar7;
      *(uint16_t *)(puVar4 + 3) = uVar16;
      *(short *)((long)puVar4 + 0xe) = (short)(uVar23 >> 0xb);
      trie->index = (uint16_t *)(puVar4 + 4);
      lVar18 = 0;
      do {
        piVar5 = buffer->index2 + lVar18;
        auVar27._0_4_ = (uint)(*piVar5 + iVar11) >> 2;
        auVar27._4_4_ = (uint)(piVar5[1] + iVar11) >> 2;
        auVar27._8_4_ = (uint)(piVar5[2] + iVar11) >> 2;
        auVar27._12_4_ = (uint)(piVar5[3] + iVar11) >> 2;
        auVar27 = pshuflw(auVar27,auVar27,0xe8);
        auVar27 = pshufhw(auVar27,auVar27,0xe8);
        *(ulong *)((long)(puVar4 + 4) + lVar18 * 2) = CONCAT44(auVar27._8_4_,auVar27._0_4_);
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x820);
      *(short *)(puVar4 + 0x414) = sVar3 + 0x80;
      *(short *)((long)puVar4 + 0x1052) = sVar3 + 0x80;
      lVar18 = 0;
      do {
        *(short *)((long)puVar4 + lVar18 + 0x1054) = (short)buffer->index2[lVar18 + 4] + sVar3;
        lVar18 = lVar18 + 2;
      } while (lVar18 != 0x3c);
      puVar17 = puVar4 + 0x424;
      if (0x10000 < (int)uVar23) {
        uVar20 = uVar23 - 0x10000 >> 0xb;
        if (0x7ff < uVar23 - 0x10000) {
          uVar23 = uVar20 + 1;
          lVar18 = 0;
          do {
            lVar21 = lVar18;
            *(undefined2 *)((long)puVar4 + lVar21 + 0x1090) =
                 *(undefined2 *)((long)buffer->index1 + lVar21 * 2 + 0x80);
            uVar23 = uVar23 - 1;
            lVar18 = lVar21 + 2;
          } while (1 < uVar23);
          puVar17 = (uint32_t *)((long)puVar4 + lVar21 + 0x1092);
        }
        if ((int)(uVar20 + 0x840) < buffer->index2Length) {
          piVar5 = buffer->index2 + (uVar20 + 0x840);
          uVar23 = (buffer->index2Length - uVar20) - 0x83f;
          do {
            iVar13 = *piVar5;
            piVar5 = piVar5 + 1;
            *(short *)puVar17 = (short)((uint)(iVar13 + iVar11) >> 2);
            puVar17 = (uint32_t *)((long)puVar17 + 2);
            uVar23 = uVar23 - 1;
          } while (1 < uVar23);
        }
      }
      if ((valueBits & UTRIE2_32_VALUE_BITS) == UTRIE2_16_VALUE_BITS) {
        trie->data16 = (uint16_t *)puVar17;
        trie->data32 = (uint32_t *)0x0;
        puVar6 = buffer->data;
        if (0 < (int)uVar10) {
          uVar10 = uVar10 + 1;
          lVar18 = 0;
          do {
            *(undefined2 *)((long)puVar17 + lVar18) = *(undefined2 *)((long)puVar6 + lVar18 * 2);
            lVar18 = lVar18 + 2;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
      }
      else {
        trie->data16 = (uint16_t *)0x0;
        trie->data32 = puVar17;
        memcpy(puVar17,buffer->data,(long)(int)uVar10 << 2);
        puVar6 = buffer->data;
      }
      uprv_free_63(puVar6);
      uprv_free_63(buffer);
      trie->newTrie = (UNewTrie2 *)0x0;
      return;
    }
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    return;
  }
LAB_001937ef:
  *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  return;
LAB_00193496:
  iVar8 = iVar8 + 4;
  lVar26 = lVar26 + 0x10;
  puVar6 = puVar17;
  iVar13 = iVar9 + 1;
  if ((int)(uVar10 - iVar9) < iVar8) goto LAB_001934a7;
  goto LAB_0019347c;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }